

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

BSDF * __thiscall
pbrt::SurfaceInteraction::GetBSDF
          (BSDF *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *ray,
          SampledWavelengths *lambda,CameraHandle *camera,ScratchBuffer *scratchBuffer,
          SamplerHandle sampler)

{
  Vector3f *woRender;
  undefined4 uVar1;
  undefined4 uVar3;
  ulong uVar2;
  Vector3f dpdvs;
  int samplesPerPixel;
  uintptr_t iptr;
  Image *pIVar4;
  SingleObject pIVar5;
  BSDF *this_00;
  uintptr_t uVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [64];
  SampledSpectrum SVar13;
  Vector3<float> VVar14;
  Normal3f ns;
  span<const_float> uc;
  span<const_pbrt::Point2<float>_> u;
  undefined1 auStack_26c [52];
  undefined1 in_stack_fffffffffffffd88 [64];
  undefined1 local_202;
  DispatchSplit<11> local_201;
  BSDF *local_200;
  ScratchBuffer *local_1f8;
  SampledWavelengths *local_1f0;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_1e8;
  Vector3<float> local_1e0;
  SampledSpectrum r;
  BxDFHandle local_1b0;
  FloatTextureHandle displacement;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1a0;
  undefined1 local_198 [16];
  MaterialHandle MStack_188;
  undefined1 auStack_180 [32];
  ulong uStack_160;
  Tuple3<pbrt::Vector3,_float> aTStack_158 [2];
  undefined1 auStack_140 [48];
  undefined1 local_110 [2] [48];
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_a0;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  TStack_98;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  TStack_90;
  undefined1 auStack_88 [32];
  ulong uStack_68;
  Tuple3<pbrt::Vector3,_float> aTStack_60 [2];
  undefined1 auStack_48 [24];
  undefined1 auVar10 [56];
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  
  local_1a0.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_200 = __return_storage_ptr__;
  local_1f8 = scratchBuffer;
  local_1f0 = lambda;
  samplesPerPixel =
       TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
       ::Dispatch<pbrt::SamplerHandle::SamplesPerPixel()const::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   *)sampler.
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     .bits);
  ComputeDifferentials(this,ray,(CameraHandle *)&local_1a0,samplesPerPixel);
  uVar6 = (this->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  while( true ) {
    this_00 = local_200;
    auVar10 = in_ZMM0._8_56_;
    if ((short)(uVar6 >> 0x30) != 0xb) break;
    MaterialEvalContext::MaterialEvalContext((MaterialEvalContext *)local_110,this);
    in_stack_fffffffffffffd88._48_8_ = local_110[1]._0_8_;
    in_stack_fffffffffffffd88._0_48_ = local_110[0];
    in_stack_fffffffffffffd88._56_8_ = local_110[1]._8_8_;
    in_ZMM0 = ZEXT1664(local_110[0]._0_16_);
    MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
              ((MixMaterial *)local_198,uVar6 & 0xffffffffffff);
    (this->material).
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = local_198._0_8_;
    uVar6 = local_198._0_8_;
  }
  if ((uVar6 & 0xffffffffffff) == 0) {
    (local_200->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (local_200->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (local_200->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (local_200->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(local_200->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0;
    (local_200->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (local_200->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (local_200->bxdf).
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = 0;
    (local_200->ng).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
    (local_200->ng).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
    *(undefined8 *)&(local_200->ng).super_Tuple3<pbrt::Normal3,_float>.z = 0;
    (local_200->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (local_200->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    BSDF::BSDF(local_200);
  }
  else {
    TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
    ::Dispatch<pbrt::MaterialHandle::GetDisplacement()const::_lambda(auto:1)_1_>
              ((TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
                *)&displacement,&this->material);
    pIVar4 = TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
             ::Dispatch<pbrt::MaterialHandle::GetNormalMap()const::_lambda(auto:1)_1_>
                       ((TaggedPointer<pbrt::CoatedDiffuseMaterial,pbrt::CoatedConductorMaterial,pbrt::ConductorMaterial,pbrt::DielectricMaterial,pbrt::DiffuseMaterial,pbrt::DiffuseTransmissionMaterial,pbrt::HairMaterial,pbrt::MeasuredMaterial,pbrt::SubsurfaceMaterial,pbrt::ThinDielectricMaterial,pbrt::MixMaterial>
                         *)&this->material);
    if (((ulong)displacement.
                super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                .bits & 0xffffffffffff) != 0 || pIVar4 != (Image *)0x0) {
      local_1e0.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      local_1e0.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      r.values.values._0_12_ = ZEXT812(0);
      local_1e0.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      local_1e8 = displacement.
                  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                  .bits;
      BumpEvalContext::BumpEvalContext((BumpEvalContext *)local_198,this);
      Bump<pbrt::UniversalTextureEvaluator>(&local_1e8,pIVar4,local_198,&r,&local_1e0);
      VVar14 = Cross<float>((Vector3<float> *)&r,&local_1e0);
      auVar7._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      local_198._0_8_ = vmovlps_avx(auVar7._0_16_);
      local_198._8_4_ = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
      ns.super_Tuple3<pbrt::Normal3,_float> =
           (Tuple3<pbrt::Normal3,_float>)Normalize<float>((Vector3<float> *)local_198);
      dpdvs.super_Tuple3<pbrt::Vector3,_float>.y = local_1e0.super_Tuple3<pbrt::Vector3,_float>.y;
      dpdvs.super_Tuple3<pbrt::Vector3,_float>.x = local_1e0.super_Tuple3<pbrt::Vector3,_float>.x;
      dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = local_1e0.super_Tuple3<pbrt::Vector3,_float>.z;
      in_stack_fffffffffffffd88._8_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar7 = in_stack_fffffffffffffd88;
      uVar1 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar3 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
      in_stack_fffffffffffffd88._4_4_ = uVar3;
      in_stack_fffffffffffffd88._0_4_ = uVar1;
      in_stack_fffffffffffffd88._8_56_ = auVar7._8_56_;
      SetShadingGeometry(this,ns,(Vector3f)r.values.values._0_12_,dpdvs,
                         (Normal3f)(this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>,
                         in_stack_fffffffffffffd88._0_12_,false);
    }
    MaterialEvalContext::MaterialEvalContext((MaterialEvalContext *)&local_a0,this);
    this_00 = local_200;
    r.values.values._8_8_ = &local_202;
    r.values.values._0_8_ = local_1f8;
    local_198._0_8_ = local_a0.bits;
    local_198._8_8_ = TStack_98.bits;
    MStack_188.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
             )(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
               )TStack_90.bits;
    auStack_180._0_8_ = auStack_88._0_8_;
    auStack_180._8_8_ = auStack_88._8_8_;
    auStack_180._16_8_ = auStack_88._16_8_;
    auStack_180._24_8_ = auStack_88._24_8_;
    uStack_160 = uStack_68;
    aTStack_158[0].x = aTStack_60[0].x;
    aTStack_158[0].y = aTStack_60[0].y;
    aTStack_158[0].z = aTStack_60[0].z;
    aTStack_158[1].x = aTStack_60[1].x;
    aTStack_158[1].y = aTStack_60[1].y;
    aTStack_158[1].z = aTStack_60[1].z;
    auStack_140._0_8_ = auStack_48._0_8_;
    auStack_140._8_8_ = auStack_48._8_8_;
    auStack_140._16_8_ = auStack_48._16_8_;
    uVar2 = (this->material).
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    local_1e0.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
    local_1e0.super_Tuple3<pbrt::Vector3,_float>.y = (float)(uVar2 >> 0x20);
    auVar10 = ZEXT856(uStack_68);
    DispatchSplit<11>::operator()(local_200,&local_201,&local_1e0,uVar2 >> 0x30);
    if ((((this_00->bxdf).
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          .bits & 0xffffffffffff) != 0) && (*(char *)(Options + 7) == '\x01')) {
      woRender = &(this->super_Interaction).wo;
      local_1e0.super_Tuple3<pbrt::Vector3,_float>.x =
           TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler.
                         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                         .bits);
      auVar8._0_8_ = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler.
                                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                   .bits);
      auVar8._8_56_ = extraout_var;
      local_198._0_8_ = vmovlps_avx(auVar8._0_16_);
      uc.n = 1;
      uc.ptr = (float *)&local_1e0;
      u.n = 1;
      u.ptr = (Point2<float> *)local_198;
      auVar11 = extraout_var;
      SVar13 = BSDF::rho(this_00,woRender,uc,u);
      auVar12._0_8_ = SVar13.values.values._8_8_;
      auVar12._8_56_ = auVar10;
      auVar9._0_8_ = SVar13.values.values._0_8_;
      auVar9._8_56_ = auVar11;
      r.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar12._0_16_);
      pIVar5 = ScratchBuffer::Alloc<pbrt::IdealDiffuseBxDF,pbrt::SampledSpectrum&>(local_1f8,&r);
      this_00 = local_200;
      local_1b0.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
      .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
               )((ulong)pIVar5 | 0x1000000000000);
      BSDF::BSDF((BSDF *)local_198,woRender,&(this->super_Interaction).n,&(this->shading).n,
                 &(this->shading).dpdu,&local_1b0);
      (this_00->bxdf).
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
      .bits = local_198._0_8_;
      (this_00->ng).super_Tuple3<pbrt::Normal3,_float>.x = (float)local_198._8_4_;
      (this_00->ng).super_Tuple3<pbrt::Normal3,_float>.y = (float)local_198._12_4_;
      *(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
        *)&(this_00->ng).super_Tuple3<pbrt::Normal3,_float>.z =
           MStack_188.
           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           .bits;
      (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_180._0_4_;
      (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = (float)auStack_180._4_4_;
      (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_180._8_4_;
      (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_180._12_4_;
      (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_180._0_4_;
      (this_00->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = (float)auStack_180._4_4_;
      (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_180._8_4_;
      (this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_180._12_4_;
      *(undefined8 *)&(this_00->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z =
           auStack_180._16_8_;
      (this_00->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_180._24_4_;
      (this_00->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = (float)auStack_180._28_4_;
    }
  }
  return this_00;
}

Assistant:

BSDF SurfaceInteraction::GetBSDF(const RayDifferential &ray, SampledWavelengths &lambda,
                                 CameraHandle camera, ScratchBuffer &scratchBuffer,
                                 SamplerHandle sampler) {
    ComputeDifferentials(ray, camera, sampler.SamplesPerPixel());
    // Resolve _MixMaterial_ if necessary
    while (material.Is<MixMaterial>()) {
        MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
        material = mix->ChooseMaterial(UniversalTextureEvaluator(), *this);
    }

    // Return unset _BSDF_ if surface has a null material
    if (!material)
        return {};

    // Evaluate bump map and compute shading normal
    FloatTextureHandle displacement = material.GetDisplacement();
    const Image *normalMap = material.GetNormalMap();
    if (displacement || normalMap) {
        Vector3f dpdu, dpdv;
        Bump(UniversalTextureEvaluator(), displacement, normalMap, *this, &dpdu, &dpdv);
        SetShadingGeometry(Normal3f(Normalize(Cross(dpdu, dpdv))), dpdu, dpdv,
                           shading.dndu, shading.dndv, false);
    }

    // Return BSDF for surface interaction
    BSDF bsdf =
        material.GetBSDF(UniversalTextureEvaluator(), *this, lambda, scratchBuffer);
    if (bsdf && GetOptions().forceDiffuse) {
        // Override _bsdf_ with diffuse equivalent
        SampledSpectrum r = bsdf.rho(wo, {sampler.Get1D()}, {sampler.Get2D()});
        bsdf = BSDF(wo, n, shading.n, shading.dpdu,
                    scratchBuffer.Alloc<IdealDiffuseBxDF>(r));
    }
    return bsdf;
}